

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O1

reference __thiscall
absl::InlinedVector<int,_4UL,_std::allocator<int>_>::emplace_back<int>
          (InlinedVector<int,_4UL,_std::allocator<int>_> *this,int *args)

{
  ulong uVar1;
  ulong uVar2;
  reference piVar3;
  Rep *pRVar4;
  ulong uVar5;
  
  uVar1 = (this->allocator_and_tag_).tag_.size_;
  uVar2 = uVar1 >> 1;
  uVar5 = 4;
  if ((uVar1 & 1) != 0) {
    uVar5 = *(ulong *)&this->rep_;
  }
  pRVar4 = &this->rep_;
  if (uVar5 < uVar2) {
    __assert_fail("s <= capacity()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/inlined_vector.h"
                  ,0x217,
                  "reference absl::InlinedVector<int, 4>::emplace_back(Args &&...) [T = int, N = 4, A = std::allocator<int>, Args = <int>]"
                 );
  }
  if (uVar2 == uVar5) {
    piVar3 = GrowAndEmplaceBack<int>(this,args);
    return piVar3;
  }
  if (uVar2 < uVar5) {
    (this->allocator_and_tag_).tag_.size_ = uVar1 + 2;
    if ((uVar1 & 1) != 0) {
      pRVar4 = *(Rep **)((long)&this->rep_ + 8);
    }
    piVar3 = (reference)((long)pRVar4 + uVar2 * 4);
    *piVar3 = *args;
    return piVar3;
  }
  __assert_fail("s < capacity()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/inlined_vector.h"
                ,0x21b,
                "reference absl::InlinedVector<int, 4>::emplace_back(Args &&...) [T = int, N = 4, A = std::allocator<int>, Args = <int>]"
               );
}

Assistant:

reference emplace_back(Args&&... args) {
    size_type s = size();
    assert(s <= capacity());
    if (ABSL_PREDICT_FALSE(s == capacity())) {
      return GrowAndEmplaceBack(std::forward<Args>(args)...);
    }
    assert(s < capacity());

    pointer space;
    if (allocated()) {
      tag().set_allocated_size(s + 1);
      space = allocated_space();
    } else {
      tag().set_inline_size(s + 1);
      space = inlined_space();
    }
    return Construct(space + s, std::forward<Args>(args)...);
  }